

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O3

void Wlc_NtkSaveOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  long lVar1;
  word *pEntry;
  uint uVar2;
  int iVar3;
  word wVar4;
  int w;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar5 = (int)((long)pWlcObj - (long)p->pObjs >> 3) * -0x55555555;
  if ((-1 < (int)uVar5) && ((int)uVar5 < (p->vCopies).nSize)) {
    uVar2 = vTtMem->nEntrySize;
    iVar3 = (p->vCopies).pArray[uVar5 & 0x7fffffff];
    iVar9 = pWlcObj->Beg - pWlcObj->End;
    iVar6 = -iVar9;
    if (0 < iVar9) {
      iVar6 = iVar9;
    }
    uVar10 = 0;
    while ((-1 < iVar3 && (lVar1 = uVar10 + (long)iVar3, lVar1 < (p->vBits).nSize))) {
      uVar5 = (p->vBits).pArray[lVar1];
      if ((int)uVar5 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = (uVar5 >> 1) * pGia->nSimWords;
      if (((int)uVar7 < 0) || (pGia->vSims->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pEntry = pGia->vSims->pArray + uVar7;
      wVar4 = *pEntry;
      if (((uint)wVar4 & 1) == 0 || (int)uVar2 < 1) {
        uVar7 = Vec_MemHashInsert(vTtMem,pEntry);
      }
      else {
        uVar8 = 0;
        do {
          pEntry[uVar8] = ~pEntry[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
        uVar7 = Vec_MemHashInsert(vTtMem,pEntry);
        uVar8 = 0;
        do {
          pEntry[uVar8] = ~pEntry[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      printf("%2d(%d) ",(ulong)uVar7,(ulong)((uVar5 ^ (uint)wVar4) & 1));
      Extra_PrintHex(_stdout,(uint *)pEntry,8);
      putchar(10);
      uVar10 = uVar10 + 1;
      if (uVar10 == iVar6 + 1) {
        putchar(10);
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wlc_NtkSaveOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = Vec_MemHashInsert( vTtMem, pInfoObj );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        printf( "%2d(%d) ", Entry, fCompl ^ Abc_LitIsCompl(iLit) );
        Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        printf( "\n" );
    }
    printf( "\n" );
}